

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O1

Result __thiscall
tonk::UDPSocket::Initialize
          (UDPSocket *this,Dependencies *deps,IPVersion bindIPVersion,uint16_t port,
          TonkSocketConfig *socketConfig,TonkSocket apiTonkSocket,
          shared_ptr<asio::io_context::strand> *asioConnectStrand)

{
  implementation_type *impl;
  int *piVar1;
  ConnectionIdMap *pCVar2;
  ostringstream *this_00;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BufferAllocator *pBVar6;
  RefCounter *owner;
  basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar7;
  pthread_mutex_t *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  INATPortPool *pIVar9;
  P2PConnectionKeyMap *pPVar10;
  uint64_t oldstate;
  uint64_t uVar11;
  OutputWorker *this_01;
  pointer __p;
  datagram_socket_service<asio::ip::udp> *pdVar12;
  error_category *peVar13;
  _func_int **pp_Var14;
  ErrorResult *pEVar15;
  long *plVar16;
  uint8_t *readBuffer;
  undefined8 *puVar17;
  undefined6 in_register_0000000a;
  undefined4 in_register_00000014;
  int iVar18;
  _func_int *p_Var19;
  long lVar20;
  Dependencies *pDVar21;
  ushort uVar22;
  Result *this_02;
  undefined1 auVar23 [8];
  error_code eVar24;
  undefined8 *in_stack_00000010;
  UDPAddress local_ep;
  error_code ec_1;
  address bindAddr;
  error_code local_270;
  undefined4 local_25c;
  undefined1 local_258 [24];
  long lStack_240;
  error_code local_238;
  undefined1 local_228 [8];
  char acStack_220 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Dependencies *local_208;
  int local_1fc;
  Result local_1f8;
  long local_1f0;
  undefined1 local_1e8 [48];
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [8];
  ErrorResult aEStack_1a8 [2];
  ios_base local_138 [264];
  
  puVar17 = (undefined8 *)CONCAT44(in_register_00000014,bindIPVersion);
  local_25c = SUB84(socketConfig,0);
  local_1fc = (int)CONCAT62(in_register_0000000a,port);
  deps[2].ReadBufferAllocator = (BufferAllocator *)puVar17[2];
  pCVar2 = (ConnectionIdMap *)puVar17[1];
  deps[1].MappedPortPtr = (shared_ptr<tonk::gateway::MappedPortLifetime> *)*puVar17;
  deps[1].IdMap = pCVar2;
  deps[2].SocketRefCount = (RefCounter *)puVar17[3];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&deps[2].Logger,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar17 + 4));
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar17[6];
  pIVar9 = (INATPortPool *)puVar17[7];
  pPVar10 = (P2PConnectionKeyMap *)puVar17[8];
  deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)puVar17[5];
  deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  deps[2].NATPool = pIVar9;
  deps[2].P2PKeyMap = pPVar10;
  deps[2].MappedPortPtr = (shared_ptr<tonk::gateway::MappedPortLifetime> *)apiTonkSocket;
  deps[2].IdMap = (ConnectionIdMap *)asioConnectStrand;
  deps[3].NATPool = (INATPortPool *)*in_stack_00000010;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&deps[3].P2PKeyMap,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_stack_00000010 + 1));
  LOCK();
  *(undefined1 *)&deps[3].SocketRefCount = 0;
  UNLOCK();
  uVar11 = siamese::GetTimeUsec();
  pCVar2 = (ConnectionIdMap *)(uVar11 * 2 + 1);
  deps[3].IdMap = pCVar2;
  deps[3].MappedPortPtr =
       (shared_ptr<tonk::gateway::MappedPortLifetime> *)((long)pCVar2 * 0x5851f42d4c957f2e);
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
  FloodDetector::Initialize
            ((FloodDetector *)local_1b8,(int)deps + 0x120,*(uint *)(apiTonkSocket + 0x24));
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)local_1b8;
  local_1b8 = (undefined1  [8])0x0;
  Result::~Result((Result *)local_1b8);
  if ((this->super_IUDPSender)._vptr_IUDPSender != (_func_int **)0x0) goto LAB_001531be;
  owner = deps[2].SocketRefCount;
  __p = (pointer)operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (__p == (pointer)0x0) {
    __p = (pointer)0x0;
  }
  else {
    local_258._0_8_ =
         &asio::detail::typeid_wrapper<asio::datagram_socket_service<asio::ip::udp>>::typeinfo;
    local_258[8] = '\0';
    local_258[9] = '\0';
    local_258[10] = '\0';
    local_258[0xb] = '\0';
    local_258[0xc] = '\0';
    local_258[0xd] = '\0';
    local_258[0xe] = '\0';
    local_258[0xf] = '\0';
    pdVar12 = (datagram_socket_service<asio::ip::udp> *)
              asio::detail::service_registry::do_use_service
                        (*(service_registry **)owner,(key *)local_258,
                         asio::detail::service_registry::
                         create<asio::datagram_socket_service<asio::ip::udp>,asio::io_context>,owner
                        );
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_ = pdVar12;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    protocol_.family_ = 2;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.socket_ = -1;
    (__p->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    super_base_implementation_type.state_ = '\0';
  }
  pDVar21 = deps + 3;
  std::
  __uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           *)pDVar21,__p);
  if (deps[3].ReadBufferAllocator == (BufferAllocator *)0x0) {
    local_1b8 = (undefined1  [8])(auStack_1b0 + 8);
    auStack_1b0 = (undefined1  [8])0x0;
    aEStack_1a8[0].Source._0_4_ = aEStack_1a8[0].Source._0_4_ & 0xffffff00;
    pp_Var14 = (_func_int **)operator_new(0x38);
    *pp_Var14 = (_func_int *)"Out of memory";
    pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
    pp_Var14[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var14 + 3) = 0;
    *(undefined4 *)(pp_Var14 + 5) = 0;
    pp_Var14[6] = (_func_int *)0x10;
    (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
    local_258._0_8_ = (ErrorResult *)0x0;
    Result::~Result((Result *)local_258);
    goto LAB_001531be;
  }
  local_270._M_value = 0;
  peVar13 = (error_category *)std::_V2::system_category();
  acStack_220[0] = '\0';
  acStack_220[1] = '\0';
  acStack_220[2] = '\0';
  acStack_220[3] = '\0';
  acStack_220[4] = '\0';
  acStack_220[5] = '\0';
  acStack_220[6] = '\0';
  acStack_220[7] = '\0';
  local_218._M_allocated_capacity._0_4_ = 0;
  local_218._M_allocated_capacity._4_4_ = 0;
  local_218._8_4_ = 0;
  local_228 = (undefined1  [8])0x2;
  local_270._M_cat = peVar13;
  local_208 = pDVar21;
  if (*(char **)(apiTonkSocket + 0x40) == (char *)0x0) {
    local_228._0_2_ = 2;
    if (local_1fc != 1) {
      local_228._0_2_ = 10;
    }
    aEStack_1a8[0].Source._0_4_ = 0;
    auStack_1b0 = (undefined1  [8])0x0;
    local_1b8 = (undefined1  [8])0x0;
    local_228._2_2_ = (ushort)local_25c << 8 | (ushort)local_25c >> 8;
    local_228._4_4_ = 0;
    acStack_220[0] = '\0';
    acStack_220[1] = '\0';
    acStack_220[2] = '\0';
    acStack_220[3] = '\0';
    acStack_220[4] = '\0';
    acStack_220[5] = '\0';
    acStack_220[6] = '\0';
    acStack_220[7] = '\0';
    local_218._M_allocated_capacity._0_4_ = 0;
    local_218._M_allocated_capacity._4_4_ = 0;
    local_218._8_4_ = 0;
  }
  else {
    asio::ip::make_address((address *)local_1b8,*(char **)(apiTonkSocket + 0x40),&local_270);
    iVar18 = local_270._M_value;
    if (local_270._M_value == 0) {
      uVar22 = (ushort)local_25c;
      if (local_1b8._0_4_ == ipv6) {
        local_228._2_2_ = uVar22 << 8 | uVar22 >> 8;
        local_228._0_2_ = 10;
        local_228._4_4_ = 0;
        auVar23 = auStack_1b0;
        local_218._M_allocated_capacity._0_4_ = aEStack_1a8[0].Source._0_4_;
        local_218._M_allocated_capacity._4_4_ = aEStack_1a8[0].Source._4_4_;
      }
      else {
        if (local_1b8._0_4_ != ipv4) {
          local_258._0_8_ = &PTR__bad_cast_001d3b98;
          puVar17 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar17 = &PTR__bad_cast_001d3b98;
          __cxa_throw(puVar17,&asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        local_228._2_2_ = uVar22 << 8 | uVar22 >> 8;
        local_218._M_allocated_capacity._0_4_ = 0;
        local_218._M_allocated_capacity._4_4_ = 0;
        local_228._0_2_ = 2;
        aEStack_1a8[0].Description._M_dataplus._M_p._0_4_ = 0;
        local_228._4_4_ = local_1b8._4_4_;
        auVar23 = (undefined1  [8])0;
      }
      acStack_220._0_4_ = SUB84(auVar23,0);
      acStack_220._4_4_ = (undefined4)((ulong)auVar23 >> 0x20);
      local_218._8_4_ = aEStack_1a8[0].Description._M_dataplus._M_p._0_4_;
    }
    else {
      (**(code **)(*(long *)local_270._M_cat + 0x20))(local_258,local_270._M_cat,local_270._M_value)
      ;
      p_Var19 = (_func_int *)(long)local_270._M_value;
      pp_Var14 = (_func_int **)operator_new(0x38);
      *pp_Var14 = (_func_int *)"Provided InterfaceAddress was invalid";
      pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var14 + 1),local_258._0_8_,
                 (type_info *)(local_258._8_8_ + local_258._0_8_));
      *(undefined4 *)(pp_Var14 + 5) = 2;
      pp_Var14[6] = p_Var19;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
      local_1f8.Error = (ErrorResult *)0x0;
      Result::~Result(&local_1f8);
      pDVar21 = local_208;
      if ((ErrorResult *)local_258._0_8_ != (ErrorResult *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_);
        pDVar21 = local_208;
      }
    }
    if (iVar18 != 0) goto LAB_001531be;
  }
  pbVar7 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              *)&pDVar21->ReadBufferAllocator)->
           super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
           ).
           super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
           ._M_head_impl;
  iVar18 = (uint)(local_228._0_2_ != 2) * 8 + 2;
  eVar24 = asio::detail::reactive_socket_service_base::do_open
                     (&(((pbVar7->
                         super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                         ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>
                        .service_)->service_impl_).super_reactive_socket_service_base,
                      &(pbVar7->
                       super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                       ).super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                       implementation_.super_base_implementation_type,iVar18,2,0x11,&local_270);
  if (eVar24._M_value == 0) {
    (pbVar7->super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
    super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.implementation_.
    protocol_.family_ = iVar18;
  }
  if (local_270._M_value == 0) {
    pbVar7 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)&local_208->ReadBufferAllocator)->
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ).
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    uVar4 = *(undefined4 *)(apiTonkSocket + 0x14);
    uVar5 = *(undefined4 *)(apiTonkSocket + 0x18);
    local_238._M_value = 0;
    local_258._0_4_ = 1;
    impl = &(pbVar7->
            super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
            super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
            implementation_;
    local_238._M_cat = peVar13;
    asio::detail::reactive_socket_service<asio::ip::udp>::
    set_option<asio::detail::socket_option::boolean<1,6>>
              (&((pbVar7->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_)
                ->service_impl_,impl,(boolean<1,_6> *)local_258,&local_238);
    if (local_238._M_value == 0) {
      local_258._0_4_ = uVar4;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::integer<1,7>>
                (&((pbVar7->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(integer<1,_7> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_0015373a;
      local_258._0_4_ = uVar5;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::integer<1,8>>
                (&((pbVar7->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(integer<1,_8> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_0015373a;
      local_258._0_4_ = 1;
      asio::detail::reactive_socket_service<asio::ip::udp>::
      set_option<asio::detail::socket_option::boolean<1,2>>
                (&((pbVar7->
                   super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>)
                   .super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                  service_)->service_impl_,impl,(boolean<1,_2> *)local_258,&local_238);
      if (local_238._M_value != 0) goto LAB_0015373a;
      local_1b8 = (undefined1  [8])0x0;
      pDVar21 = local_208;
    }
    else {
LAB_0015373a:
      (**(code **)(*(long *)local_238._M_cat + 0x20))
                (local_1e8 + 0x10,local_238._M_cat,local_238._M_value);
      plVar16 = (long *)std::__cxx11::string::append(local_1e8 + 0x10);
      pEVar15 = (ErrorResult *)(plVar16 + 2);
      if ((ErrorResult *)*plVar16 == pEVar15) {
        local_1e8._0_8_ = pEVar15->Source;
        local_1e8._8_8_ = plVar16[3];
        local_1f8.Error = (ErrorResult *)local_1e8;
      }
      else {
        local_1e8._0_8_ = pEVar15->Source;
        local_1f8.Error = (ErrorResult *)*plVar16;
      }
      local_1f0 = plVar16[1];
      *plVar16 = (long)pEVar15;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      pEVar15 = (ErrorResult *)(plVar16 + 2);
      if ((ErrorResult *)*plVar16 == pEVar15) {
        local_258._16_8_ = pEVar15->Source;
        lStack_240 = plVar16[3];
        local_258._0_8_ = (ErrorResult *)(local_258 + 0x10);
      }
      else {
        local_258._16_8_ = pEVar15->Source;
        local_258._0_8_ = (ErrorResult *)*plVar16;
      }
      local_258._8_8_ = *(uchar (*) [8])(plVar16 + 1);
      *plVar16 = (long)pEVar15;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      lVar20 = (long)local_238._M_value;
      pEVar15 = (ErrorResult *)operator_new(0x38);
      pEVar15->Source = "set_option";
      (pEVar15->Description)._M_dataplus._M_p = (pointer)&(pEVar15->Description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pEVar15->Description,local_258._0_8_,
                 (type_info *)(local_258._8_8_ + local_258._0_8_));
      pEVar15->Type = Asio;
      pEVar15->Code = lVar20;
      local_1b8 = (undefined1  [8])pEVar15;
      if ((ErrorResult *)local_258._0_8_ != (ErrorResult *)(local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_);
      }
      if (local_1f8.Error != (ErrorResult *)local_1e8) {
        operator_delete(local_1f8.Error);
      }
      pDVar21 = local_208;
      if ((undefined1 *)local_1e8._16_8_ != local_1e8 + 0x20) {
        operator_delete((void *)local_1e8._16_8_);
      }
    }
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)local_1b8;
    local_1b8 = (undefined1  [8])0x0;
    Result::~Result((Result *)local_1b8);
    if ((this->super_IUDPSender)._vptr_IUDPSender != (_func_int **)0x0) goto LAB_001531be;
    pbVar7 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)&pDVar21->ReadBufferAllocator)->
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ).
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    asio::detail::reactive_socket_service<asio::ip::udp>::bind
              (&((pbVar7->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_)
                ->service_impl_,(int)pbVar7 + 8,(sockaddr *)local_228,(socklen_t)&local_270);
    if (local_270._M_value != 0) {
      (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
      p_Var19 = (_func_int *)(long)local_270._M_value;
      pp_Var14 = (_func_int **)operator_new(0x38);
      *pp_Var14 = (_func_int *)"UDP socket bind failed";
      pp_Var14[1] = (_func_int *)(pp_Var14 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var14 + 1),local_1b8,
                 (undefined1 *)((long)(char **)local_1b8 + (long)auStack_1b0));
      *(undefined4 *)(pp_Var14 + 5) = 2;
      pp_Var14[6] = p_Var19;
      (this->super_IUDPSender)._vptr_IUDPSender = pp_Var14;
      local_258._0_8_ = (ErrorResult *)0x0;
      Result::~Result((Result *)local_258);
      if (local_1b8 != (undefined1  [8])(auStack_1b0 + 8)) {
        operator_delete((void *)local_1b8);
      }
      goto LAB_001531be;
    }
    pbVar7 = (((tuple<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                *)&pDVar21->ReadBufferAllocator)->
             super__Tuple_impl<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
             ).
             super__Head_base<0UL,_asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_*,_false>
             ._M_head_impl;
    asio::detail::reactive_socket_service<asio::ip::udp>::local_endpoint
              ((endpoint_type *)local_258,
               &((pbVar7->
                 super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                 super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.service_)
                ->service_impl_,
               &(pbVar7->
                super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>).
                super_basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>.
                implementation_,&local_270);
    if (local_270._M_value == 0) {
      uVar3 = swap_bytes(local_258._2_2_);
      *(undefined2 *)&deps[5].P2PKeyMap = uVar3;
      __mutex = (pthread_mutex_t *)deps[1].MappedPortPtr;
      iVar18 = pthread_mutex_lock(__mutex);
      if (iVar18 != 0) {
        std::__throw_system_error(iVar18);
      }
      readBuffer = pktalloc::Allocator::Allocate((Allocator *)&__mutex[1].__data,0x546);
      if (__mutex != (pthread_mutex_t *)0x0) {
        pthread_mutex_unlock(__mutex);
      }
      if (readBuffer == (uint8_t *)0x0) {
        Result::OutOfMemory();
        (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)local_1b8;
        local_1b8 = (undefined1  [8])0x0;
        Result::~Result((Result *)local_1b8);
      }
      else {
        LOCK();
        piVar1 = (int *)((long)&((deps[1].IdMap)->IdLock).cs.super___recursive_mutex_base._M_mutex +
                        0x20);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
        postNextRead((UDPSocket *)deps,readBuffer);
      }
      goto LAB_001531be;
    }
    (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
    lVar20 = (long)local_270._M_value;
    pEVar15 = (ErrorResult *)operator_new(0x38);
    pEVar15->Source = "local_endpoint failed";
    (pEVar15->Description)._M_dataplus._M_p = (pointer)&(pEVar15->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar15->Description,local_1b8,
               (undefined1 *)((long)(char **)local_1b8 + (long)auStack_1b0));
    pEVar15->Type = Asio;
    pEVar15->Code = lVar20;
    this_02 = &local_1f8;
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)pEVar15;
    local_1f8.Error = pEVar15;
  }
  else {
    (**(code **)(*(long *)local_270._M_cat + 0x20))(local_1b8);
    lVar20 = (long)local_270._M_value;
    pEVar15 = (ErrorResult *)operator_new(0x38);
    pEVar15->Source = "UDP socket open failed";
    (pEVar15->Description)._M_dataplus._M_p = (pointer)&(pEVar15->Description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pEVar15->Description,local_1b8,
               (undefined1 *)((long)(char **)local_1b8 + (long)auStack_1b0));
    pEVar15->Type = Asio;
    pEVar15->Code = lVar20;
    this_02 = (Result *)local_258;
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)pEVar15;
    local_258._0_8_ = pEVar15;
  }
  this_02->Error = (ErrorResult *)0x0;
  Result::~Result(this_02);
  if (local_1b8 != (undefined1  [8])(auStack_1b0 + 8)) {
    operator_delete((void *)local_1b8);
  }
LAB_001531be:
  if ((this->super_IUDPSender)._vptr_IUDPSender != (_func_int **)0x0) {
    pBVar6 = deps[2].ReadBufferAllocator;
    Result::ToJson_abi_cxx11_((string *)local_228,(Result *)this);
    if ((pBVar6->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__data.__owner < 5) {
      local_1b8 = (undefined1  [8])
                  (pBVar6->AllocatorLock).cs.super___recursive_mutex_base._M_mutex.__align;
      this_00 = (ostringstream *)(auStack_1b0 + 8);
      auStack_1b0._0_4_ = 4;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)(pBVar6->Allocator).PreferredWindows.PreallocatedData[1]
                 ,(long)(pBVar6->Allocator).PreferredWindows.PreallocatedData[2]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"UDPSocket::Initialize failed: ",0x1e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(char *)local_228,CONCAT44(acStack_220._4_4_,acStack_220._0_4_))
      ;
      this_01 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
    }
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228);
    }
    CloseSocket((UDPSocket *)deps);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result UDPSocket::Initialize(
    const Dependencies& deps,
    IPVersion bindIPVersion,
    uint16_t port,
    const TonkSocketConfig* socketConfig,
    TonkSocket apiTonkSocket,
    std::shared_ptr<asio::io_context::strand> asioConnectStrand)
{
    Deps = deps;
    SocketConfig = socketConfig;
    APITonkSocket = apiTonkSocket;
    AsioConnectStrand = asioConnectStrand;
    TONK_DEBUG_ASSERT(asioConnectStrand != nullptr);
    SocketClosed = false;

#ifdef TONK_ENABLE_ARTIFICIAL_PACKETLOSS
#ifdef TONK_DEFAULT_ARTIFICIAL_PACKETLOSS
    SetArtificialPacketloss(TONK_DEFAULT_ARTIFICIAL_PACKETLOSS);
#endif
    ArtificialPacketlossPRNG.Seed(siamese::GetTimeUsec());
#endif

    Result result;

    try
    {
        result = FloodDetect.Initialize(
            socketConfig->MaximumClientsPerIP,
            socketConfig->MinuteFloodThresh
        );
        if (result.IsFail()) {
            goto OnError;
        }

        // Create a UDP socket for the connection attempt
        Socket = MakeUniqueNoThrow<asio::ip::udp::socket>(*Deps.Context);
        if (!Socket)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        asio::error_code ec;

        // If application specified an interface address:
        UDPAddress bindAddress;
        if (socketConfig->InterfaceAddress)
        {
            // Convert provided interface address to Asio address
            asio::ip::address bindAddr = asio::ip::make_address(socketConfig->InterfaceAddress, ec);
            if (ec)
            {
                result = Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
                goto OnError;
            }

            // Bind to the provided interface address
            bindAddress = UDPAddress(bindAddr, port);
        }
        else
        {
            // Create an IPv4/IPv6 socket based on the server address type
            asio::ip::udp internet_protocol = (bindIPVersion == IPVersion::V4)
                ? asio::ip::udp::v4() : asio::ip::udp::v6();

            // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
            bindAddress = UDPAddress(internet_protocol, port);
        }

        // Open socket
        Socket->open(bindAddress.protocol(), ec);
        if (ec)
        {
            result = Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Set common socket options before bind
        result = SetUDPSocketOptions(
            *Socket,
            socketConfig->UDPSendBufferSizeBytes,
            socketConfig->UDPRecvBufferSizeBytes);
        if (result.IsFail()) {
            goto OnError;
        }

        // Bind socket
        Socket->bind(bindAddress, ec);
        if (ec)
        {
            result = Result("UDP socket bind failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }

        // Get local bound port
        const UDPAddress local_ep = Socket->local_endpoint(ec);
        if (ec)
        {
            result = Result("local_endpoint failed", ec.message(), ErrorType::Asio, ec.value());
            goto OnError;
        }
        LocalBoundPort = local_ep.port();

#ifdef TONK_DONT_FRAGMENT
        result = dontFragment(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_DONT_FRAGMENT

#ifdef TONK_IGNORE_ICMP_UNREACHABLE
        result = ignoreUnreachable(true);
        if (result.IsFail()) {
            goto OnError;
        }
#endif // TONK_IGNORE_ICMP_UNREACHABLE

        // Allocate the first read buffer
        uint8_t* readBuffer = Deps.ReadBufferAllocator->Allocate(kReadBufferBytes);
        if (!readBuffer)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        // Post the first read
        Deps.SocketRefCount->IncrementReferences();
        postNextRead(readBuffer);
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("UDPSocket::CreateSocket", "Exception!", ErrorType::Asio);
    }

OnError:
    if (result.IsFail())
    {
        Deps.Logger->Error("UDPSocket::Initialize failed: ", result.ToJson());
        CloseSocket();
    }
    return result;
}